

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::write11F_11F_10F_Channel(GLuint channel,GLdouble value,GLubyte *pixel)

{
  StorageType SVar1;
  TestError *this;
  Float<unsigned_int,_5,_5,_15,_2U> local_3c;
  deUint32 bits_2;
  Float<unsigned_int,_5,_5,_15,_2U> val_2;
  deUint32 bits_1;
  Float<unsigned_int,_5,_6,_15,_2U> val_1;
  deUint32 bits;
  Float<unsigned_int,_5,_6,_15,_2U> val;
  deUint32 *ptr;
  GLubyte *pixel_local;
  GLdouble value_local;
  GLuint channel_local;
  
  if (channel == 0) {
    tcu::Float<unsigned_int,_5,_6,_15,_2U>::Float(&val_1,value);
    SVar1 = tcu::Float<unsigned_int,_5,_6,_15,_2U>::bits(&val_1);
    *(StorageType *)pixel = SVar1 | *(uint *)pixel;
  }
  else if (channel == 1) {
    tcu::Float<unsigned_int,_5,_6,_15,_2U>::Float((Float<unsigned_int,_5,_6,_15,_2U> *)&val_2,value)
    ;
    SVar1 = tcu::Float<unsigned_int,_5,_6,_15,_2U>::bits
                      ((Float<unsigned_int,_5,_6,_15,_2U> *)&val_2);
    *(StorageType *)pixel = SVar1 << 0xb | *(uint *)pixel;
  }
  else {
    if (channel != 2) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid channel",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x8dc);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    tcu::Float<unsigned_int,_5,_5,_15,_2U>::Float(&local_3c,value);
    SVar1 = tcu::Float<unsigned_int,_5,_5,_15,_2U>::bits(&local_3c);
    *(StorageType *)pixel = SVar1 << 0x16 | *(uint *)pixel;
  }
  return;
}

Assistant:

void write11F_11F_10F_Channel(GLuint channel, GLdouble value, GLubyte* pixel)
{
	deUint32* ptr = (deUint32*)pixel;

	switch (channel)
	{
	case 0:
	{
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> val(value);
		deUint32 bits = val.bits();

		*ptr |= bits;
	}
	break;
	case 1:
	{
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> val(value);
		deUint32 bits = val.bits();

		*ptr |= (bits << 11);
	}
	break;
	case 2:
	{
		tcu::Float<deUint32, 5, 5, 15, tcu::FLOAT_SUPPORT_DENORM> val(value);
		deUint32 bits = val.bits();

		*ptr |= (bits << 22);
	}
	break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}
}